

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

int insertvar(char *s,attr *a)

{
  bool bVar1;
  char *in_RDI;
  attr *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  Env *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RDI,(allocator *)&stack0xffffffffffffffcf);
  bVar1 = Env::insertvar(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return (uint)bVar1;
}

Assistant:

int insertvar(const char *s, const struct attr *a) {
    return current->insertvar(s, *a);
}